

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O3

void __thiscall
dynamicgraph::SignalPtr<double,_int>::checkCompatibility(SignalPtr<double,_int> *this)

{
  int iVar1;
  Signal<double,_int> *pSVar2;
  undefined8 *puVar3;
  _func_int *p_Var4;
  
  iVar1 = (*this->_vptr_SignalPtr[4])();
  if (((char)iVar1 != '\0') &&
     (this->signalPtr !=
      (Signal<double,_int> *)((long)&this->_vptr_SignalPtr + (long)this->_vptr_SignalPtr[-3]))) {
    pSVar2 = getPtr(this);
    (*(pSVar2->super_SignalBase<int>)._vptr_SignalBase[0x17])(pSVar2);
    return;
  }
  iVar1 = (*this->_vptr_SignalPtr[6])(this);
  if ((char)iVar1 == '\0') {
    p_Var4 = this->_vptr_SignalPtr[-3];
  }
  else {
    p_Var4 = this->_vptr_SignalPtr[-3];
    if (this->signalPtr != (Signal<double,_int> *)((long)&this->_vptr_SignalPtr + (long)p_Var4)) {
      (*this->abstractTransmitter->_vptr_SignalBase[0x17])();
      return;
    }
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = *(undefined8 *)(&this->field_0x48 + (long)p_Var4);
  __cxa_throw(puVar3,&double*::typeinfo,0);
}

Assistant:

void SignalPtr<T, Time>::checkCompatibility() {
  if (isPlugged() && (!autoref())) {
    getPtr()->checkCompatibility();
  } else if (isAbstractPluged() && (!autoref())) {
    abstractTransmitter->checkCompatibility();
  } else
    Signal<T, Time>::checkCompatibility();
}